

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O0

void TestDouble_IsInfinite(void)

{
  uint64_t min_double64;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  Double *in_stack_ffffffffffffffc0;
  Double *this;
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  
  double_conversion::Double::Infinity();
  double_conversion::Double::Double
            (in_stack_ffffffffffffffc0,
             (double)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  double_conversion::Double::IsInfinite(in_stack_ffffffffffffffc0);
  CheckHelper(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,(char *)in_stack_ffffffffffffffc0,
              (bool)in_stack_ffffffffffffffbf);
  double_conversion::Double::Infinity();
  double_conversion::Double::Double
            (in_stack_ffffffffffffffc0,
             (double)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  double_conversion::Double::IsInfinite(in_stack_ffffffffffffffc0);
  CheckHelper(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,(char *)in_stack_ffffffffffffffc0,
              (bool)in_stack_ffffffffffffffbf);
  double_conversion::Double::NaN();
  double_conversion::Double::Double
            (in_stack_ffffffffffffffc0,
             (double)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  double_conversion::Double::IsInfinite(in_stack_ffffffffffffffc0);
  CheckHelper(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,(char *)in_stack_ffffffffffffffc0,
              (bool)in_stack_ffffffffffffffbf);
  double_conversion::Double::Double
            (in_stack_ffffffffffffffc0,
             (double)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  double_conversion::Double::IsInfinite(in_stack_ffffffffffffffc0);
  CheckHelper(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,(char *)in_stack_ffffffffffffffc0,
              (bool)in_stack_ffffffffffffffbf);
  double_conversion::Double::Double
            (in_stack_ffffffffffffffc0,
             (double)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  double_conversion::Double::IsInfinite(in_stack_ffffffffffffffc0);
  CheckHelper(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,(char *)in_stack_ffffffffffffffc0,
              (bool)in_stack_ffffffffffffffbf);
  double_conversion::Double::Double
            (in_stack_ffffffffffffffc0,
             (double)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  double_conversion::Double::IsInfinite(in_stack_ffffffffffffffc0);
  CheckHelper(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,(char *)in_stack_ffffffffffffffc0,
              (bool)in_stack_ffffffffffffffbf);
  double_conversion::Double::Double
            (in_stack_ffffffffffffffc0,
             (double)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  double_conversion::Double::IsInfinite(in_stack_ffffffffffffffc0);
  CheckHelper(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,(char *)in_stack_ffffffffffffffc0,
              (bool)in_stack_ffffffffffffffbf);
  this = (Double *)0x1;
  double_conversion::Double::Double((Double *)&stack0xffffffffffffffb8,1);
  double_conversion::Double::IsInfinite(this);
  CheckHelper(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,(char *)this,
              (bool)in_stack_ffffffffffffffbf);
  return;
}

Assistant:

TEST(Double_IsInfinite) {
  CHECK(Double(Double::Infinity()).IsInfinite());
  CHECK(Double(-Double::Infinity()).IsInfinite());
  CHECK(!Double(Double::NaN()).IsInfinite());
  CHECK(!Double(0.0).IsInfinite());
  CHECK(!Double(-0.0).IsInfinite());
  CHECK(!Double(1.0).IsInfinite());
  CHECK(!Double(-1.0).IsInfinite());
  uint64_t min_double64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x00000000, 00000001);
  CHECK(!Double(min_double64).IsInfinite());
}